

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3EvalSelectDeferred(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3TokenAndCost *aTC,int nTC)

{
  sqlite3_stmt sVar1;
  int iVar2;
  Fts3Table *pTab;
  Fts3PhraseToken *pFVar3;
  sqlite3_stmt *psVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  char *pBuf;
  Fts3TokenAndCost *pFVar8;
  Fts3DeferredToken *pFVar9;
  sqlite3_stmt *psVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  char *pEnd;
  Fts3TokenAndCost *pFVar15;
  int iVar16;
  long in_FS_OFFSET;
  bool bVar17;
  int local_9c;
  int nList;
  sqlite3_int64 nDoc;
  sqlite3_stmt *pStmt;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTab = (Fts3Table *)(pCsr->base).pVtab;
  if (pTab->zContentTbl == (char *)0x0) {
    uVar7 = 0;
    uVar11 = (ulong)(uint)nTC;
    if (nTC < 1) {
      uVar11 = uVar7;
    }
    iVar12 = 0;
    iVar16 = 0;
    for (; uVar11 * 0x28 - uVar7 != 0; uVar7 = uVar7 + 0x28) {
      if (*(Fts3Expr **)((long)&aTC->pRoot + uVar7) == pRoot) {
        iVar12 = iVar12 + *(int *)((long)&aTC->nOvfl + uVar7);
        iVar16 = iVar16 + 1;
      }
    }
    if (1 < iVar16 && iVar12 != 0) {
      local_9c = pCsr->nRowAvg;
      iVar12 = 0;
      if (local_9c == 0) {
        nDoc = 0;
        pStmt = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
        _nList = 0;
        iVar12 = sqlite3Fts3SelectDoctotal(pTab,&pStmt);
        psVar4 = pStmt;
        if (iVar12 == 0) {
          pBuf = (char *)sqlite3_column_blob(pStmt,0);
          if (pBuf != (char *)0x0) {
            iVar12 = sqlite3_column_bytes(psVar4,0);
            pEnd = pBuf + iVar12;
            iVar12 = sqlite3Fts3GetVarintBounded(pBuf,pEnd,&nDoc);
            while (pBuf = pBuf + iVar12, pBuf < pEnd) {
              iVar12 = sqlite3Fts3GetVarintBounded(pBuf,pEnd,(sqlite_int64 *)&nList);
            }
            if (_nList != 0 && nDoc != 0) {
              pCsr->nDoc = nDoc;
              pCsr->nRowAvg = (int)(((long)_nList / nDoc + (long)pTab->nPgsz) / (long)pTab->nPgsz);
              iVar12 = sqlite3_reset(psVar4);
              local_9c = pCsr->nRowAvg;
              goto LAB_001b20a4;
            }
          }
          sqlite3_reset(psVar4);
          iVar12 = 0x10b;
        }
        local_9c = 0;
      }
LAB_001b20a4:
      uVar13 = 0;
      iVar5 = 1;
      iVar6 = 0;
      while (((int)uVar13 < iVar16 && (iVar12 == 0))) {
        pFVar15 = (Fts3TokenAndCost *)0x0;
        pFVar8 = aTC;
        uVar7 = uVar11;
        while (bVar17 = uVar7 != 0, uVar7 = uVar7 - 1, bVar17) {
          if (((pFVar8->pToken != (Fts3PhraseToken *)0x0) && (pFVar8->pRoot == pRoot)) &&
             ((pFVar15 == (Fts3TokenAndCost *)0x0 || (pFVar8->nOvfl < pFVar15->nOvfl)))) {
            pFVar15 = pFVar8;
          }
          pFVar8 = pFVar8 + 1;
        }
        if (uVar13 == 0) {
          iVar5 = iVar5 << 2;
LAB_001b2179:
          _nList = _nList & 0xffffffff00000000;
          nDoc = 0;
          iVar12 = fts3TermSelect(pTab,pFVar15->pToken,pFVar15->iCol,&nList,(char **)&nDoc);
          if (iVar12 == 0) {
            iVar12 = fts3EvalPhraseMergeToken
                               (pTab,pFVar15->pPhrase,pFVar15->iToken,(char *)nDoc,nList);
            if (iVar12 == 0) {
              psVar4 = (sqlite3_stmt *)(pFVar15->pPhrase->doclist).aAll;
              iVar12 = 0;
              iVar14 = 0;
              if (psVar4 != (sqlite3_stmt *)0x0) {
                iVar2 = (pFVar15->pPhrase->doclist).nAll;
                iVar14 = 0;
                psVar10 = psVar4;
                while (psVar10 < psVar4 + iVar2) {
                  do {
                    sVar1 = *psVar10;
                    psVar10 = psVar10 + 1;
                  } while ((char)sVar1 < '\0');
                  iVar14 = iVar14 + 1;
                  pStmt = psVar10;
                  fts3PoslistCopy((char **)0x0,(char **)&pStmt);
                  psVar10 = pStmt;
                }
              }
              if (iVar14 < iVar6) {
                iVar6 = iVar14;
              }
              if (uVar13 == 0) {
                iVar6 = iVar14;
              }
            }
          }
        }
        else if (pFVar15->nOvfl < ((iVar6 + iVar5 / 4 + -1) / (iVar5 / 4)) * local_9c) {
          if (uVar13 < 0xc) {
            iVar5 = iVar5 * 4;
          }
          iVar12 = 0;
          if (uVar13 != iVar16 - 1U && 1 < pFVar15->pPhrase->nToken) goto LAB_001b2179;
        }
        else {
          pFVar3 = pFVar15->pToken;
          iVar14 = pFVar15->iCol;
          pFVar9 = (Fts3DeferredToken *)sqlite3_malloc64(0x20);
          iVar12 = 7;
          if (pFVar9 != (Fts3DeferredToken *)0x0) {
            pFVar9->pToken = (Fts3PhraseToken *)0x0;
            *(undefined8 *)&pFVar9->iCol = 0;
            pFVar9->pNext = (Fts3DeferredToken *)0x0;
            pFVar9->pList = (PendingList *)0x0;
            pFVar9->pToken = pFVar3;
            pFVar9->pNext = pCsr->pDeferred;
            pFVar9->iCol = iVar14;
            pCsr->pDeferred = pFVar9;
            pFVar3->pDeferred = pFVar9;
            iVar12 = 0;
          }
          fts3SegReaderCursorFree(pFVar3->pSegcsr);
          pFVar3->pSegcsr = (Fts3MultiSegReader *)0x0;
        }
        pFVar15->pToken = (Fts3PhraseToken *)0x0;
        uVar13 = uVar13 + 1;
      }
      goto LAB_001b1f78;
    }
  }
  iVar12 = 0;
LAB_001b1f78:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar12;
}

Assistant:

static int fts3EvalSelectDeferred(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Consider tokens with this root node */
  Fts3TokenAndCost *aTC,          /* Array of expression tokens and costs */
  int nTC                         /* Number of entries in aTC[] */
){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int nDocSize = 0;               /* Number of pages per doc loaded */
  int rc = SQLITE_OK;             /* Return code */
  int ii;                         /* Iterator variable for various purposes */
  int nOvfl = 0;                  /* Total overflow pages used by doclists */
  int nToken = 0;                 /* Total number of tokens in cluster */

  int nMinEst = 0;                /* The minimum count for any phrase so far. */
  int nLoad4 = 1;                 /* (Phrases that will be loaded)^4. */

  /* Tokens are never deferred for FTS tables created using the content=xxx
  ** option. The reason being that it is not guaranteed that the content
  ** table actually contains the same data as the index. To prevent this from
  ** causing any problems, the deferred token optimization is completely
  ** disabled for content=xxx tables. */
  if( pTab->zContentTbl ){
    return SQLITE_OK;
  }

  /* Count the tokens in this AND/NEAR cluster. If none of the doclists
  ** associated with the tokens spill onto overflow pages, or if there is
  ** only 1 token, exit early. No tokens to defer in this case. */
  for(ii=0; ii<nTC; ii++){
    if( aTC[ii].pRoot==pRoot ){
      nOvfl += aTC[ii].nOvfl;
      nToken++;
    }
  }
  if( nOvfl==0 || nToken<2 ) return SQLITE_OK;

  /* Obtain the average docsize (in pages). */
  rc = fts3EvalAverageDocsize(pCsr, &nDocSize);
  assert( rc!=SQLITE_OK || nDocSize>0 );


  /* Iterate through all tokens in this AND/NEAR cluster, in ascending order
  ** of the number of overflow pages that will be loaded by the pager layer
  ** to retrieve the entire doclist for the token from the full-text index.
  ** Load the doclists for tokens that are either:
  **
  **   a. The cheapest token in the entire query (i.e. the one visited by the
  **      first iteration of this loop), or
  **
  **   b. Part of a multi-token phrase.
  **
  ** After each token doclist is loaded, merge it with the others from the
  ** same phrase and count the number of documents that the merged doclist
  ** contains. Set variable "nMinEst" to the smallest number of documents in
  ** any phrase doclist for which 1 or more token doclists have been loaded.
  ** Let nOther be the number of other phrases for which it is certain that
  ** one or more tokens will not be deferred.
  **
  ** Then, for each token, defer it if loading the doclist would result in
  ** loading N or more overflow pages into memory, where N is computed as:
  **
  **    (nMinEst + 4^nOther - 1) / (4^nOther)
  */
  for(ii=0; ii<nToken && rc==SQLITE_OK; ii++){
    int iTC;                      /* Used to iterate through aTC[] array. */
    Fts3TokenAndCost *pTC = 0;    /* Set to cheapest remaining token. */

    /* Set pTC to point to the cheapest remaining token. */
    for(iTC=0; iTC<nTC; iTC++){
      if( aTC[iTC].pToken && aTC[iTC].pRoot==pRoot
       && (!pTC || aTC[iTC].nOvfl<pTC->nOvfl)
      ){
        pTC = &aTC[iTC];
      }
    }
    assert( pTC );

    if( ii && pTC->nOvfl>=((nMinEst+(nLoad4/4)-1)/(nLoad4/4))*nDocSize ){
      /* The number of overflow pages to load for this (and therefore all
      ** subsequent) tokens is greater than the estimated number of pages
      ** that will be loaded if all subsequent tokens are deferred.
      */
      Fts3PhraseToken *pToken = pTC->pToken;
      rc = sqlite3Fts3DeferToken(pCsr, pToken, pTC->iCol);
      fts3SegReaderCursorFree(pToken->pSegcsr);
      pToken->pSegcsr = 0;
    }else{
      /* Set nLoad4 to the value of (4^nOther) for the next iteration of the
      ** for-loop. Except, limit the value to 2^24 to prevent it from
      ** overflowing the 32-bit integer it is stored in. */
      if( ii<12 ) nLoad4 = nLoad4*4;

      if( ii==0 || (pTC->pPhrase->nToken>1 && ii!=nToken-1) ){
        /* Either this is the cheapest token in the entire query, or it is
        ** part of a multi-token phrase. Either way, the entire doclist will
        ** (eventually) be loaded into memory. It may as well be now. */
        Fts3PhraseToken *pToken = pTC->pToken;
        int nList = 0;
        char *pList = 0;
        rc = fts3TermSelect(pTab, pToken, pTC->iCol, &nList, &pList);
        assert( rc==SQLITE_OK || pList==0 );
        if( rc==SQLITE_OK ){
          rc = fts3EvalPhraseMergeToken(
              pTab, pTC->pPhrase, pTC->iToken,pList,nList
          );
        }
        if( rc==SQLITE_OK ){
          int nCount;
          nCount = fts3DoclistCountDocids(
              pTC->pPhrase->doclist.aAll, pTC->pPhrase->doclist.nAll
          );
          if( ii==0 || nCount<nMinEst ) nMinEst = nCount;
        }
      }
    }
    pTC->pToken = 0;
  }

  return rc;
}